

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

bool __thiscall Map::Load(Map *this)

{
  short sVar1;
  World *pWVar2;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  EffectType EVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  TileSpec TVar11;
  uint uVar12;
  uint uVar13;
  WarpSpec WVar14;
  int iVar15;
  mapped_type *pmVar16;
  FILE *__stream;
  size_t sVar17;
  Map_Tile *pMVar18;
  ENF_Data *pEVar19;
  NPC *this_00;
  EIF_Data *pEVar20;
  long lVar21;
  uchar index;
  byte x;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *p_Var22;
  bool bVar23;
  char buf [12];
  short local_104;
  uint local_100;
  short local_fc;
  allocator<char> local_f5;
  uint local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  shared_ptr<Map_Chest> chest_1;
  Map_Chest chest;
  string filename;
  char namebuf [6];
  
  if (this->id < 0) {
    return false;
  }
  pWVar2 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chest,"MapDir",(allocator<char> *)&chest_1);
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&chest);
  util::variant::GetString_abi_cxx11_(&filename,pmVar16);
  std::__cxx11::string::~string((string *)&chest);
  sprintf(namebuf,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::append((char *)&filename);
  std::__cxx11::string::append((char *)&filename);
  map_safe_fail_filename = filename._M_dataplus._M_p;
  __stream = fopen(filename._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    this->has_timed_spikes = false;
    iVar5 = fseek(__stream,3,0);
    iVar15 = 0x1d1;
    if (iVar5 == 0) {
      sVar17 = fread(this->rid,1,4,__stream);
      iVar15 = 0x1d2;
      if (sVar17 == 4) {
        iVar5 = fseek(__stream,0x1f,0);
        if (iVar5 == 0) {
          sVar17 = fread(buf,1,2,__stream);
          if (sVar17 == 2) {
            uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
            this->pk = uVar6 == 3;
            EVar7 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
            this->effect = EVar7;
            iVar5 = fseek(__stream,0x25,0);
            if (iVar5 == 0) {
              sVar17 = fread(buf,1,2,__stream);
              if (sVar17 == 2) {
                uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                this->width = (char)uVar6 + '\x01';
                uVar6 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                bVar4 = (char)uVar6 + 1;
                this->height = bVar4;
                std::vector<Map_Tile,_std::allocator<Map_Tile>_>::resize
                          (&this->tiles,(ulong)this->width * (ulong)bVar4);
                iVar5 = fseek(__stream,0x2a,0);
                if (iVar5 == 0) {
                  sVar17 = fread(buf,1,3,__stream);
                  if (sVar17 == 3) {
                    uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                    this->scroll = uVar6 != 0;
                    uVar6 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                    this->relog_x = (uchar)uVar6;
                    uVar6 = PacketProcessor::Number(buf[2],0xfe,0xfe,0xfe);
                    this->relog_y = (uchar)uVar6;
                    iVar5 = fseek(__stream,0x2e,0);
                    if (iVar5 == 0) {
                      sVar17 = fread(buf,1,1,__stream);
                      if (sVar17 == 1) {
                        uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                        if (((char)uVar6 == '\0') ||
                           (iVar5 = fseek(__stream,(ulong)((uVar6 & 0xff) << 3),1), iVar5 == 0)) {
                          sVar17 = fread(buf,1,1,__stream);
                          if (sVar17 == 1) {
                            uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                            if (((char)uVar6 == '\0') ||
                               (iVar5 = fseek(__stream,(ulong)((uVar6 & 0xff) << 2),1), iVar5 == 0))
                            {
                              sVar17 = fread(buf,1,1,__stream);
                              if (sVar17 == 1) {
                                uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                if (((uVar6 & 0xff) == 0) ||
                                   (iVar5 = fseek(__stream,(ulong)((uVar6 & 0xff) * 0xc),1),
                                   iVar5 == 0)) {
                                  sVar17 = fread(buf,1,1,__stream);
                                  if (sVar17 == 1) {
                                    uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                    local_e8 = (vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                *)&this->chests;
                                    local_f0 = local_f0 & 0xffffffff00000000;
                                    while ((uint)local_f0 != (uVar6 & 0xff)) {
                                      sVar17 = fread(buf,1,2,__stream);
                                      if (sVar17 != 2) {
                                        fclose(__stream);
                                        map_safe_fail(0x204);
                                        goto LAB_00157390;
                                      }
                                      uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      uVar9 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                      uVar9 = uVar9 & 0xff;
                                      bVar4 = (byte)uVar8;
                                      while (bVar23 = uVar9 != 0, uVar9 = uVar9 - 1, bVar23) {
                                        sVar17 = fread(buf,1,2,__stream);
                                        if (sVar17 != 2) {
                                          fclose(__stream);
                                          map_safe_fail(0x209);
                                          goto LAB_00157390;
                                        }
                                        uVar10 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                        TVar11 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                        x = (byte)uVar10;
                                        if ((x < this->width) && (bVar4 < this->height)) {
                                          pMVar18 = GetTile(this,x,bVar4);
                                          pMVar18->tilespec = TVar11 & 0xff;
                                          if ((char)TVar11 == '\"') {
                                            this->has_timed_spikes = true;
                                          }
                                          else if ((TVar11 & 0xff) == Chest) {
                                            chest.items.
                                            super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                            ._M_impl._M_node.super__List_node_base._M_next =
                                                 (_List_node_base *)&chest.items;
                                            chest.items.
                                            super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                            ._M_impl._M_node._M_size = 0;
                                            chest.spawns.
                                            super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                            ._M_impl._M_node.super__List_node_base._M_next =
                                                 (_List_node_base *)&chest.spawns;
                                            chest.spawns.
                                            super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                            ._M_impl._M_node._M_size = 0;
                                            pWVar2 = this->world;
                                            chest.items.
                                            super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                            ._M_impl._M_node.super__List_node_base._M_prev =
                                                 chest.items.
                                                 super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                 ._M_impl._M_node.super__List_node_base._M_next;
                                            chest.spawns.
                                            super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                            ._M_impl._M_node.super__List_node_base._M_prev =
                                                 chest.spawns.
                                                 super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                 ._M_impl._M_node.super__List_node_base._M_next;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&chest_1,"MaxChest",&local_f5);
                                            pmVar16 = std::__detail::
                                                                                                            
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar2->config,(key_type *)&chest_1);
                                            chest.maxchest = util::variant::GetInt(pmVar16);
                                            std::__cxx11::string::~string((string *)&chest_1);
                                            pWVar2 = this->world;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&chest_1,"ChestSlots",&local_f5);
                                            pmVar16 = std::__detail::
                                                                                                            
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar2->config,(key_type *)&chest_1);
                                            chest.chestslots = util::variant::GetInt(pmVar16);
                                            std::__cxx11::string::~string((string *)&chest_1);
                                            chest.y = bVar4;
                                            chest.x = x;
                                            chest.slots = 0;
                                            std::make_shared<Map_Chest,Map_Chest&>
                                                      ((Map_Chest *)&chest_1);
                                            std::
                                            vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                            ::emplace_back<std::shared_ptr<Map_Chest>>
                                                      (local_e8,&chest_1);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            Map_Chest::~Map_Chest(&chest);
                                          }
                                        }
                                        else {
                                          Console::Wrn(
                                                  "Tile spec on map %i is outside of map bounds (%ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)(uVar10 & 0xff)
                                                  ,(ulong)(uVar8 & 0xff));
                                        }
                                      }
                                      local_f0 = CONCAT44(local_f0._4_4_,(uint)local_f0 + 1);
                                    }
                                    sVar17 = fread(buf,1,1,__stream);
                                    if (sVar17 == 1) {
                                      local_d8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      local_d8 = local_d8 & 0xff;
                                      for (local_f4 = 0; local_f4 != local_d8;
                                          local_f4 = local_f4 + 1) {
                                        sVar17 = fread(buf,1,2,__stream);
                                        if (sVar17 != 2) {
                                          fclose(__stream);
                                          map_safe_fail(0x22b);
                                          goto LAB_00157390;
                                        }
                                        uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                        local_100 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                        local_100 = local_100 & 0xff;
                                        local_f0 = CONCAT44(local_f0._4_4_,uVar6) &
                                                   0xffffffff000000ff;
                                        local_e8 = (
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)CONCAT71(local_e8._1_7_,(uchar)uVar6);
                                        while (bVar23 = local_100 != 0, local_100 = local_100 - 1,
                                              bVar23) {
                                          sVar17 = fread(buf,1,8,__stream);
                                          if (sVar17 != 8) {
                                            fclose(__stream);
                                            map_safe_fail(0x231);
                                            goto LAB_00157390;
                                          }
                                          uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          uVar9 = PacketProcessor::Number(buf[1],buf[2],0xfe,0xfe);
                                          uVar10 = PacketProcessor::Number(buf[3],0xfe,0xfe,0xfe);
                                          uVar12 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                          uVar13 = PacketProcessor::Number(buf[5],0xfe,0xfe,0xfe);
                                          WVar14 = PacketProcessor::Number(buf[6],buf[7],0xfe,0xfe);
                                          if (((byte)uVar8 < this->width) &&
                                             ((byte)local_e8 < this->height)) {
                                            pMVar18 = GetTile(this,(byte)uVar8,(uchar)uVar6);
                                            (pMVar18->warp).map = (short)uVar9;
                                            (pMVar18->warp).x = (uchar)uVar10;
                                            (pMVar18->warp).y = (uchar)uVar12;
                                            (pMVar18->warp).levelreq = (uchar)uVar13;
                                            (pMVar18->warp).spec = WVar14;
                                            (pMVar18->warp).open = false;
                                          }
                                          else {
                                            Console::Wrn(
                                                  "Warp on map %i is outside of map bounds (%ix%i)",
                                                  (ulong)(uint)(int)this->id,(ulong)(uVar8 & 0xff),
                                                  local_f0 & 0xffffffff);
                                          }
                                        }
                                      }
                                      iVar5 = fseek(__stream,0x2e,0);
                                      if (iVar5 == 0) {
                                        sVar17 = fread(buf,1,1,__stream);
                                        if (sVar17 == 1) {
                                          uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          index = '\0';
                                          for (local_d4 = 0; local_d4 != (uVar6 & 0xff);
                                              local_d4 = local_d4 + 1) {
                                            sVar17 = fread(buf,1,8,__stream);
                                            if (sVar17 != 8) {
                                              fclose(__stream);
                                              map_safe_fail(0x252);
                                              goto LAB_00157390;
                                            }
                                            uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                            uVar9 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                            uVar10 = PacketProcessor::Number
                                                               (buf[2],buf[3],0xfe,0xfe);
                                            local_dc = PacketProcessor::Number
                                                                 (buf[4],0xfe,0xfe,0xfe);
                                            uVar12 = PacketProcessor::Number
                                                               (buf[5],buf[6],0xfe,0xfe);
                                            local_f0 = CONCAT44(local_f0._4_4_,uVar12);
                                            uVar12 = PacketProcessor::Number(buf[7],0xfe,0xfe,0xfe);
                                            local_104 = (short)uVar10;
                                            uVar10 = (uint)local_104;
                                            pEVar19 = ENF::Get(this->world->enf,uVar10);
                                            if (pEVar19->id == 0) {
                                              local_e8 = (
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)(CONCAT44(local_e8._4_4_,uVar9) &
                                                    0xffffffff000000ff);
                                              Console::Wrn(
                                                  "An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)uVar10);
                                            }
                                            else {
                                              local_e8 = (
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)(CONCAT44(local_e8._4_4_,uVar9) &
                                                    0xffffffff000000ff);
                                            }
                                            uVar12 = uVar12 & 0xff;
                                            local_f0 = (ulong)(uint)(int)(short)local_f0;
                                            local_d8 = uVar9 & 0xff;
                                            local_dc = local_dc & 0xff;
                                            local_f4 = uVar8 & 0xff;
                                            while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23
                                                  ) {
                                              if (((byte)uVar8 < this->width) &&
                                                 ((byte)uVar9 < this->height)) {
                                                this_00 = (NPC *)operator_new(0x70);
                                                NPC::NPC(this_00,this,local_104,(uchar)local_f4,
                                                         (uchar)local_d8,(uchar)local_dc,
                                                         (short)local_f0,index,false);
                                                chest._0_8_ = this_00;
                                                std::vector<NPC_*,_std::allocator<NPC_*>_>::
                                                push_back(&this->npcs,(value_type *)&chest);
                                                NPC::Spawn((NPC *)chest._0_8_,(NPC *)0x0);
                                                index = index + '\x01';
                                              }
                                              else {
                                                sVar1 = this->id;
                                                pEVar19 = ENF::Get(this->world->enf,uVar10);
                                                Console::Wrn(
                                                  "An NPC spawn on map %i is outside of map bounds (%s at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar1,
                                                  (pEVar19->name)._M_dataplus._M_p,
                                                  (ulong)(uVar8 & 0xff),(ulong)local_e8 & 0xffffffff
                                                  );
                                              }
                                            }
                                          }
                                          sVar17 = fread(buf,1,1,__stream);
                                          iVar5 = 0x26e;
                                          if (sVar17 == 1) {
                                            uVar6 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                            if ((char)uVar6 != '\0') {
                                              iVar15 = fseek(__stream,(ulong)((uVar6 & 0xff) << 2),1
                                                            );
                                              iVar5 = 0x272;
                                              if (iVar15 != 0) goto LAB_00158199;
                                            }
                                            sVar17 = fread(buf,1,1,__stream);
                                            iVar5 = 0x275;
                                            if (sVar17 == 1) {
                                              local_f4 = PacketProcessor::Number
                                                                   (buf[0],0xfe,0xfe,0xfe);
                                              local_f4 = local_f4 & 0xff;
                                              for (local_100 = 0; local_100 != local_f4;
                                                  local_100 = local_100 + 1) {
                                                sVar17 = fread(buf,1,0xc,__stream);
                                                if (sVar17 != 0xc) {
                                                  fclose(__stream);
                                                  map_safe_fail(0x279);
                                                  goto LAB_00157390;
                                                }
                                                uVar6 = PacketProcessor::Number
                                                                  (buf[0],0xfe,0xfe,0xfe);
                                                uVar8 = PacketProcessor::Number
                                                                  (buf[1],0xfe,0xfe,0xfe);
                                                uVar9 = PacketProcessor::Number
                                                                  (buf[4],0xfe,0xfe,0xfe);
                                                local_f0 = CONCAT44(local_f0._4_4_,uVar9);
                                                uVar9 = PacketProcessor::Number
                                                                  (buf[5],buf[6],0xfe,0xfe);
                                                uVar10 = PacketProcessor::Number
                                                                   (buf[7],buf[8],0xfe,0xfe);
                                                uVar12 = PacketProcessor::Number
                                                                   (buf[9],buf[10],buf[0xb],0xfe);
                                                local_e8 = (
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)CONCAT44(local_e8._4_4_,uVar12);
                                                local_fc = (short)uVar9;
                                                uVar9 = (uint)local_fc;
                                                pEVar20 = EIF::Get(this->world->eif,uVar9);
                                                if (uVar9 != pEVar20->id) {
                                                  Console::Wrn(
                                                  "A chest spawn on map %i uses a non-existent item (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)uVar9,
                                                  (ulong)(uVar6 & 0xff),(ulong)(uVar8 & 0xff));
                                                }
                                                p_Var3 = &((this->chests).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                ;
                                                for (p_Var22 = &((this->chests).
                                                                                                                                  
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ; p_Var22 != p_Var3; p_Var22 = p_Var22 + 1) {
                                                  std::
                                                  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr(&chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ,p_Var22);
                                                  if (((chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->x == (uchar)uVar6) &&
                                                  ((chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->y == (uchar)uVar8)) {
                                                    iVar5 = (short)local_f0 + 1;
                                                    chest.items.
                                                                                                        
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_6_ = CONCAT24((short)uVar10,iVar5);
                                                  chest.items.
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node._M_size =
                                                       (size_t)Timer::GetTime();
                                                  chest._4_2_ = local_fc;
                                                  chest.items.
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next =
                                                       (_List_node_base *)
                                                       CONCAT44(chest.items.
                                                                                                                                
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next.
                                                  _4_4_,(undefined4)local_e8);
                                                  std::__cxx11::
                                                  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                  ::push_back(&(chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->spawns,(value_type *)&chest);
                                                  if (iVar5 < (chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->slots) {
                                                    iVar5 = (chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->slots;
                                                  }
                                                  (chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->slots = iVar5;
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  goto LAB_00158163;
                                                  }
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&chest_1.
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                }
                                                sVar1 = this->id;
                                                pEVar20 = EIF::Get(this->world->eif,uVar9);
                                                Console::Wrn(
                                                  "A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar1,
                                                  (pEVar20->name)._M_dataplus._M_p,
                                                  (ulong)local_e8 & 0xffffffff,(ulong)(uVar6 & 0xff)
                                                  ,(ulong)(uVar8 & 0xff));
LAB_00158163:
                                              }
                                              iVar15 = fseek(__stream,0,2);
                                              iVar5 = 0x29c;
                                              if (iVar15 == 0) {
                                                lVar21 = ftell(__stream);
                                                this->filesize = (int)lVar21;
                                                fclose(__stream);
                                                this->exists = true;
                                                bVar23 = true;
                                                goto LAB_00157392;
                                              }
                                            }
                                          }
LAB_00158199:
                                          fclose(__stream);
                                          map_safe_fail(iVar5);
                                          goto LAB_00157390;
                                        }
                                        fclose(__stream);
                                        iVar5 = 0x24d;
                                      }
                                      else {
                                        fclose(__stream);
                                        iVar5 = 0x24c;
                                      }
                                    }
                                    else {
                                      fclose(__stream);
                                      iVar5 = 0x227;
                                    }
                                  }
                                  else {
                                    fclose(__stream);
                                    iVar5 = 0x200;
                                  }
                                }
                                else {
                                  fclose(__stream);
                                  iVar5 = 0x1fd;
                                }
                              }
                              else {
                                fclose(__stream);
                                iVar5 = 0x1f9;
                              }
                            }
                            else {
                              fclose(__stream);
                              iVar5 = 0x1f6;
                            }
                          }
                          else {
                            fclose(__stream);
                            iVar5 = 0x1f2;
                          }
                        }
                        else {
                          fclose(__stream);
                          iVar5 = 0x1ef;
                        }
                      }
                      else {
                        fclose(__stream);
                        iVar5 = 0x1eb;
                      }
                    }
                    else {
                      fclose(__stream);
                      iVar5 = 0x1ea;
                    }
                  }
                  else {
                    fclose(__stream);
                    iVar5 = 0x1e5;
                  }
                }
                else {
                  fclose(__stream);
                  iVar5 = 0x1e4;
                }
              }
              else {
                fclose(__stream);
                iVar5 = 0x1de;
              }
            }
            else {
              fclose(__stream);
              iVar5 = 0x1dd;
            }
          }
          else {
            fclose(__stream);
            iVar5 = 0x1d9;
          }
        }
        else {
          fclose(__stream);
          iVar5 = 0x1d8;
        }
        map_safe_fail(iVar5);
        goto LAB_00157390;
      }
    }
    fclose(__stream);
    map_safe_fail(iVar15);
  }
LAB_00157390:
  bVar23 = false;
LAB_00157392:
  std::__cxx11::string::~string((string *)&filename);
  return bVar23;
}

Assistant:

bool Map::Load()
{
	char namebuf[6];

	if (this->id < 0)
	{
		return false;
	}

	std::string filename = this->world->config["MapDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename.append(namebuf);
	filename.append(".emf");

	map_safe_fail_filename = filename.c_str();

	std::FILE *fh = std::fopen(filename.c_str(), "rb");

	if (!fh)
		return false;

	this->has_timed_spikes = false;

	SAFE_SEEK(fh, 0x03, SEEK_SET);
	SAFE_READ(this->rid, sizeof(char), 4, fh);

	char buf[12];
	unsigned char outersize;
	unsigned char innersize;

	SAFE_SEEK(fh, 0x1F, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->pk = PacketProcessor::Number(buf[0]) == 3;
	this->effect = static_cast<EffectType>(PacketProcessor::Number(buf[1]));

	SAFE_SEEK(fh, 0x25, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->width = PacketProcessor::Number(buf[0]) + 1;
	this->height = PacketProcessor::Number(buf[1]) + 1;

	this->tiles.resize(this->height * this->width);

	SAFE_SEEK(fh, 0x2A, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 3, fh);
	this->scroll = PacketProcessor::Number(buf[0]);
	this->relog_x = PacketProcessor::Number(buf[1]);
	this->relog_y = PacketProcessor::Number(buf[2]);

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 8 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 12 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			SAFE_READ(buf, sizeof(char), 2, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			unsigned char spec = PacketProcessor::Number(buf[1]);

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Tile spec on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			this->GetTile(xloc, yloc).tilespec = static_cast<Map_Tile::TileSpec>(spec);

			if (spec == Map_Tile::Chest)
			{
				Map_Chest chest;
				chest.maxchest = static_cast<int>(this->world->config["MaxChest"]);
				chest.chestslots = static_cast<int>(this->world->config["ChestSlots"]);
				chest.x = xloc;
				chest.y = yloc;
				chest.slots = 0;
				this->chests.push_back(std::make_shared<Map_Chest>(chest));
			}

			if (spec == Map_Tile::Spikes1)
			{
				this->has_timed_spikes = true;
			}
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			Map_Warp newwarp;
			SAFE_READ(buf, sizeof(char), 8, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			newwarp.map = PacketProcessor::Number(buf[1], buf[2]);
			newwarp.x = PacketProcessor::Number(buf[3]);
			newwarp.y = PacketProcessor::Number(buf[4]);
			newwarp.levelreq = PacketProcessor::Number(buf[5]);
			newwarp.spec = static_cast<Map_Warp::WarpSpec>(PacketProcessor::Number(buf[6], buf[7]));

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Warp on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			try
			{
				this->GetTile(xloc, yloc).warp = newwarp;
			}
			catch (...)
			{
				std::fclose(fh);
				map_safe_fail(__LINE__);
				return false;
			}
		}
	}

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	int index = 0;
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 8, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short npc_id = PacketProcessor::Number(buf[2], buf[3]);
		unsigned char spawntype = PacketProcessor::Number(buf[4]);
		short spawntime = PacketProcessor::Number(buf[5], buf[6]);
		unsigned char amount = PacketProcessor::Number(buf[7]);

		if (!this->world->enf->Get(npc_id))
		{
			Console::Wrn("An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)", this->id, npc_id, x, y);
		}

		for (int ii = 0; ii < amount; ++ii)
		{
			if (!this->InBounds(x, y))
			{
				Console::Wrn("An NPC spawn on map %i is outside of map bounds (%s at %ix%i)", this->id, this->world->enf->Get(npc_id).name.c_str(), x, y);
				continue;
			}

			NPC *newnpc = new NPC(this, npc_id, x, y, spawntype, spawntime, index++);
			this->npcs.push_back(newnpc);

			newnpc->Spawn();
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 12, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short slot = PacketProcessor::Number(buf[4]);
		short itemid = PacketProcessor::Number(buf[5], buf[6]);
		short time = PacketProcessor::Number(buf[7], buf[8]);
		int amount = PacketProcessor::Number(buf[9], buf[10], buf[11]);

		if (itemid != this->world->eif->Get(itemid).id)
		{
			Console::Wrn("A chest spawn on map %i uses a non-existent item (#%i at %ix%i)", this->id, itemid, x, y);
		}

		UTIL_FOREACH(this->chests, chest)
		{
			if (chest->x == x && chest->y == y)
			{
				Map_Chest_Spawn spawn;

				spawn.slot = slot+1;
				spawn.time = time;
				spawn.last_taken = Timer::GetTime();
				spawn.item.id = itemid;
				spawn.item.amount = amount;

				chest->spawns.push_back(spawn);
				chest->slots = std::max(chest->slots, slot+1);
				goto skip_warning;
			}
		}
		Console::Wrn("A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)", this->id, this->world->eif->Get(itemid).name.c_str(), amount, x, y);
		skip_warning:
		;
	}

	SAFE_SEEK(fh, 0x00, SEEK_END);
	this->filesize = std::ftell(fh);

	std::fclose(fh);

	this->exists = true;

	return true;
}